

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

void __thiscall BVSparse<Memory::ArenaAllocator>::~BVSparse(BVSparse<Memory::ArenaAllocator> *this)

{
  BVSparseNode *node;
  
  for (node = this->head; node != (BVSparseNode *)0x0; node = DeleteNode(this,node,true)) {
  }
  return;
}

Assistant:

BVSparse<TAllocator>::~BVSparse()
{
    BVSparseNode * curNode = this->head;
    while (curNode != nullptr)
    {
        curNode = this->DeleteNode(curNode);
    }
}